

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Color * LoadImageColors(Image image)

{
  ushort uVar1;
  undefined2 uVar2;
  Color *pCVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_0000001c;
  
  if (in_stack_00000014 == 0 || in_stack_00000010 == 0) {
    pCVar3 = (Color *)0x0;
  }
  else {
    uVar5 = in_stack_00000014 * in_stack_00000010;
    pCVar3 = (Color *)malloc((long)(int)uVar5 << 2);
    if (in_stack_0000001c < 0xe) {
      if (in_stack_0000001c - 8U < 3) {
        TraceLog(4,"IMAGE: Pixel format converted from 32bit to 8bit per channel");
      }
      if (in_stack_0000001c - 0xbU < 3) {
        TraceLog(4,"IMAGE: Pixel format converted from 16bit to 8bit per channel");
      }
      if (0 < (int)uVar5) {
        uVar8 = 0;
        iVar6 = 0;
        do {
          switch(in_stack_0000001c) {
          case 1:
            pCVar3[uVar8].r = *(uchar *)(in_stack_00000008 + uVar8);
            pCVar3[uVar8].g = *(uchar *)(in_stack_00000008 + uVar8);
            pCVar3[uVar8].b = *(uchar *)(in_stack_00000008 + uVar8);
            goto LAB_0014c786;
          case 2:
            lVar7 = (long)iVar6;
            pCVar3[uVar8].r = *(uchar *)(in_stack_00000008 + lVar7);
            pCVar3[uVar8].g = *(uchar *)(in_stack_00000008 + lVar7);
            pCVar3[uVar8].b = *(uchar *)(in_stack_00000008 + lVar7);
            pCVar3[uVar8].a = *(uchar *)(in_stack_00000008 + 1 + lVar7);
            iVar6 = iVar6 + 2;
            break;
          case 3:
            uVar1 = *(ushort *)(in_stack_00000008 + uVar8 * 2);
            pCVar3[uVar8].r = (byte)(uVar1 >> 8) & 0xf8;
            pCVar3[uVar8].g = (byte)(uVar1 >> 3) & 0xfc;
            pCVar3[uVar8].b = (char)uVar1 << 3;
LAB_0014c786:
            pCVar3[uVar8].a = 0xff;
            break;
          case 4:
            lVar7 = (long)iVar6;
            pCVar3[uVar8].r = *(uchar *)(in_stack_00000008 + lVar7);
            pCVar3[uVar8].g = *(uchar *)(in_stack_00000008 + 1 + lVar7);
            pCVar3[uVar8].b = *(uchar *)(in_stack_00000008 + 2 + lVar7);
            goto LAB_0014c8f4;
          case 5:
            uVar1 = *(ushort *)(in_stack_00000008 + uVar8 * 2);
            pCVar3[uVar8].r = (byte)(uVar1 >> 8) & 0xf8;
            pCVar3[uVar8].g = (byte)(uVar1 >> 3) & 0xf8;
            pCVar3[uVar8].b = (byte)uVar1 * '\x04' & 0xf8;
            pCVar3[uVar8].a = -((byte)uVar1 & 1);
            break;
          case 6:
            uVar2 = *(undefined2 *)(in_stack_00000008 + uVar8 * 2);
            bVar4 = (byte)((ushort)uVar2 >> 8);
            pCVar3[uVar8].r = bVar4 & 0xf0 | bVar4 >> 4;
            pCVar3[uVar8].g = (bVar4 & 0xf) * '\x11';
            bVar4 = (byte)uVar2;
            pCVar3[uVar8].b = (bVar4 >> 4) * '\x11';
            pCVar3[uVar8].a = (bVar4 & 0xf) * '\x11';
            break;
          case 7:
            lVar7 = (long)iVar6;
            pCVar3[uVar8].r = *(uchar *)(in_stack_00000008 + lVar7);
            pCVar3[uVar8].g = *(uchar *)(in_stack_00000008 + 1 + lVar7);
            pCVar3[uVar8].b = *(uchar *)(in_stack_00000008 + 2 + lVar7);
            pCVar3[uVar8].a = *(uchar *)(in_stack_00000008 + 3 + lVar7);
            goto LAB_0014c871;
          case 8:
            fVar9 = *(float *)(in_stack_00000008 + (long)iVar6 * 4);
            goto LAB_0014c88d;
          case 9:
            lVar7 = (long)iVar6;
            pCVar3[uVar8].r = (uchar)(int)(*(float *)(in_stack_00000008 + lVar7 * 4) * 255.0);
            pCVar3[uVar8].g = (uchar)(int)(*(float *)(in_stack_00000008 + 4 + lVar7 * 4) * 255.0);
            fVar9 = *(float *)(in_stack_00000008 + 8 + lVar7 * 4);
            goto LAB_0014c8eb;
          case 10:
            lVar7 = (long)iVar6;
            pCVar3[uVar8].r = (uchar)(int)(*(float *)(in_stack_00000008 + lVar7 * 4) * 255.0);
            pCVar3[uVar8].g = (uchar)(int)(*(float *)(in_stack_00000008 + 4 + lVar7 * 4) * 255.0);
            pCVar3[uVar8].b = (uchar)(int)(*(float *)(in_stack_00000008 + 8 + lVar7 * 4) * 255.0);
            fVar9 = *(float *)(in_stack_00000008 + 0xc + lVar7 * 4);
            goto LAB_0014c752;
          case 0xb:
            fVar9 = HalfToFloat(*(unsigned_short *)(in_stack_00000008 + (long)iVar6 * 2));
LAB_0014c88d:
            pCVar3[uVar8].r = (uchar)(int)(fVar9 * 255.0);
            pCVar3[uVar8].g = '\0';
            pCVar3[uVar8].b = '\0';
            pCVar3[uVar8].a = 0xff;
            iVar6 = iVar6 + 1;
            break;
          case 0xc:
            lVar7 = (long)iVar6;
            fVar9 = HalfToFloat(*(unsigned_short *)(in_stack_00000008 + lVar7 * 2));
            pCVar3[uVar8].r = (uchar)(int)(fVar9 * 255.0);
            fVar9 = HalfToFloat(*(unsigned_short *)(in_stack_00000008 + 2 + lVar7 * 2));
            pCVar3[uVar8].g = (uchar)(int)(fVar9 * 255.0);
            fVar9 = HalfToFloat(*(unsigned_short *)(in_stack_00000008 + 4 + lVar7 * 2));
LAB_0014c8eb:
            pCVar3[uVar8].b = (uchar)(int)(fVar9 * 255.0);
LAB_0014c8f4:
            pCVar3[uVar8].a = 0xff;
            iVar6 = iVar6 + 3;
            break;
          case 0xd:
            lVar7 = (long)iVar6;
            fVar9 = HalfToFloat(*(unsigned_short *)(in_stack_00000008 + lVar7 * 2));
            pCVar3[uVar8].r = (uchar)(int)(fVar9 * 255.0);
            fVar9 = HalfToFloat(*(unsigned_short *)(in_stack_00000008 + 2 + lVar7 * 2));
            pCVar3[uVar8].g = (uchar)(int)(fVar9 * 255.0);
            fVar9 = HalfToFloat(*(unsigned_short *)(in_stack_00000008 + 4 + lVar7 * 2));
            pCVar3[uVar8].b = (uchar)(int)(fVar9 * 255.0);
            fVar9 = HalfToFloat(*(unsigned_short *)(in_stack_00000008 + 6 + lVar7 * 2));
LAB_0014c752:
            pCVar3[uVar8].a = (uchar)(int)(fVar9 * 255.0);
LAB_0014c871:
            iVar6 = iVar6 + 4;
          }
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
    }
    else {
      TraceLog(4,"IMAGE: Pixel data retrieval not supported for compressed image formats");
    }
  }
  return pCVar3;
}

Assistant:

Color *LoadImageColors(Image image)
{
    if ((image.width == 0) || (image.height == 0)) return NULL;

    Color *pixels = (Color *)RL_MALLOC(image.width*image.height*sizeof(Color));

    if (image.format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "IMAGE: Pixel data retrieval not supported for compressed image formats");
    else
    {
        if ((image.format == PIXELFORMAT_UNCOMPRESSED_R32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32A32)) TRACELOG(LOG_WARNING, "IMAGE: Pixel format converted from 32bit to 8bit per channel");

        if ((image.format == PIXELFORMAT_UNCOMPRESSED_R16) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R16G16B16) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R16G16B16A16)) TRACELOG(LOG_WARNING, "IMAGE: Pixel format converted from 16bit to 8bit per channel");

        for (int i = 0, k = 0; i < image.width*image.height; i++)
        {
            switch (image.format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    pixels[i].r = ((unsigned char *)image.data)[i];
                    pixels[i].g = ((unsigned char *)image.data)[i];
                    pixels[i].b = ((unsigned char *)image.data)[i];
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k];
                    pixels[i].b = ((unsigned char *)image.data)[k];
                    pixels[i].a = ((unsigned char *)image.data)[k + 1];

                    k += 2;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111000000) >> 6)*(255/31));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000000111110) >> 1)*(255/31));
                    pixels[i].a = (unsigned char)((pixel & 0b0000000000000001)*255);

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111100000) >> 5)*(255/63));
                    pixels[i].b = (unsigned char)((float)(pixel & 0b0000000000011111)*(255/31));
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111000000000000) >> 12)*(255/15));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000111100000000) >> 8)*(255/15));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000011110000) >> 4)*(255/15));
                    pixels[i].a = (unsigned char)((float)(pixel & 0b0000000000001111)*(255/15));

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k + 1];
                    pixels[i].b = ((unsigned char *)image.data)[k + 2];
                    pixels[i].a = ((unsigned char *)image.data)[k + 3];

                    k += 4;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    pixels[i].r = (unsigned char)((unsigned char *)image.data)[k];
                    pixels[i].g = (unsigned char)((unsigned char *)image.data)[k + 1];
                    pixels[i].b = (unsigned char)((unsigned char *)image.data)[k + 2];
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = 0;
                    pixels[i].b = 0;
                    pixels[i].a = 255;

                    k += 1;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k + 1]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k + 2]*255.0f);
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k + 1]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k + 2]*255.0f);
                    pixels[i].a = (unsigned char)(((float *)image.data)[k + 3]*255.0f);

                    k += 4;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16:
                {
                    pixels[i].r = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k])*255.0f);
                    pixels[i].g = 0;
                    pixels[i].b = 0;
                    pixels[i].a = 255;

                    k += 1;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16:
                {
                    pixels[i].r = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k])*255.0f);
                    pixels[i].g = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 1])*255.0f);
                    pixels[i].b = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 2])*255.0f);
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16A16:
                {
                    pixels[i].r = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k])*255.0f);
                    pixels[i].g = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 1])*255.0f);
                    pixels[i].b = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 2])*255.0f);
                    pixels[i].a = (unsigned char)(HalfToFloat(((unsigned short *)image.data)[k + 3])*255.0f);

                    k += 4;
                } break;
                default: break;
            }
        }
    }

    return pixels;
}